

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O1

void __thiscall
slang::parsing::NumberParser::addDigit(NumberParser *this,logic_t digit,int maxValue)

{
  logic_t local_1;
  
  if ((digit.value == 0x80) || (digit.value == '@')) {
    this->hasUnknown = true;
  }
  else {
    if (maxValue <= (int)(uint)digit.value) {
      assert::assertFailed
                ("digit.value < maxValue",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/NumberParser.cpp"
                 ,0x110,"void slang::parsing::NumberParser::addDigit(logic_t, int)");
    }
    if (((this->digits).super_SmallVectorBase<slang::logic_t>.len == 1) &&
       (((this->digits).super_SmallVectorBase<slang::logic_t>.data_)->value == '\0')) {
      if (digit.value == '\0') {
        return;
      }
      (this->digits).super_SmallVectorBase<slang::logic_t>.len = 0;
    }
  }
  SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t_const&>
            (&(this->digits).super_SmallVectorBase<slang::logic_t>,&local_1);
  return;
}

Assistant:

void NumberParser::addDigit(logic_t digit, int maxValue) {
    // Leading zeros obviously don't count towards our bit limit, so
    // only count them if we've seen other non-zero digits
    if (digit.isUnknown()) {
        // Keep one leading zero, if any, for msb extension
        hasUnknown = true;
    }
    else {
        ASSERT(digit.value < maxValue);
        if (digits.size() == 1 && digits.front().value == 0) {
            if (digit.value == 0)
                return; // at most one leading zero

            // If first nonzero not unknown, no leading zeros
            digits.pop_back();
        }
    }
    digits.push_back(digit);
}